

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::InterfaceInstantiationStmt::InterfaceInstantiationStmt
          (InterfaceInstantiationStmt *this,Generator *parent,InterfaceRef *interface)

{
  __node_base *p_Var1;
  
  Stmt::Stmt(&this->super_Stmt,InterfaceInstantiation);
  InstantiationStmt::InstantiationStmt(&this->super_InstantiationStmt);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b4a88;
  (this->super_InstantiationStmt)._vptr_InstantiationStmt =
       (_func_int **)&PTR_instantiation_type_002b4b08;
  this->interface_ = interface;
  p_Var1 = &(interface->ports_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    InstantiationStmt::process_port
              (&this->super_InstantiationStmt,(Port *)p_Var1[5]._M_nxt,parent,&interface->name_);
  }
  interface->has_instantiated_ = true;
  return;
}

Assistant:

InterfaceInstantiationStmt::InterfaceInstantiationStmt(kratos::Generator *parent,
                                                       kratos::InterfaceRef *interface)
    : Stmt(StatementType::InterfaceInstantiation), interface_(interface) {
    for (auto const &[port_name, port] : interface->ports()) {
        process_port(port, parent, interface->name());
    }
    interface->has_instantiated() = true;
}